

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_WriteAfterHandshakeSentFatalAlert_Test::TestBody
          (SSLVersionTest_WriteAfterHandshakeSentFatalAlert_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  const_iterator pbVar2;
  SSL *pSVar3;
  char *pcVar4;
  uchar *buf;
  size_type sVar5;
  BIO *pBVar6;
  pointer psVar7;
  pointer pbVar8;
  BIO_METHOD *type;
  ulong uVar9;
  char *in_R9;
  pointer local_3a0;
  char *local_398;
  AssertHelper local_388;
  Message local_380;
  uint local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_340;
  Message local_338;
  int local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__5;
  Message local_310;
  uint local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_5;
  Message local_2e8;
  int local_2e0 [2];
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_4;
  Message local_2c0;
  int local_2b8 [2];
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_280;
  Message local_278;
  int local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__4;
  Message local_250;
  uint local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_210;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__3;
  size_t len;
  uint8_t *unused;
  uint32_t err;
  Message local_1c8;
  int local_1c0 [2];
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_1;
  Message local_1a0;
  int local_198 [2];
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  string local_178;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<BIO> mem;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIO> rbio;
  value_type_conflict3 local_cc [4];
  int local_c8;
  value_type_conflict3 local_c3 [3];
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> invalid;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  unique_ptr<ssl_st,_bssl::internal::Deleter> local_50;
  UniquePtr<SSL> ssl;
  ScopedTrace gtest_trace_3200;
  bool test_server;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_28;
  initializer_list<bool> *local_18;
  initializer_list<bool> *__range2;
  SSLVersionTest_WriteAfterHandshakeSentFatalAlert_Test *this_local;
  
  __begin2._6_1_ = 0;
  __begin2._7_1_ = 1;
  local_28._M_array = (iterator)((long)&__begin2 + 6);
  local_28._M_len = 2;
  local_18 = &local_28;
  __range2 = (initializer_list<bool> *)this;
  __end2 = std::initializer_list<bool>::begin(local_18);
  pbVar2 = std::initializer_list<bool>::end(local_18);
  while( true ) {
    if (__end2 == pbVar2) {
      return;
    }
    ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>
    ._M_head_impl._7_1_ = *__end2 & 1;
    if (ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._7_1_ == 0) {
      local_398 = "client";
    }
    else {
      local_398 = "server";
    }
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)
               ((long)&ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 6),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xc80,local_398);
    if ((ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._7_1_ & 1) == 0) {
      local_3a0 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                            (&(this->super_SSLVersionTest).client_ctx_);
    }
    else {
      local_3a0 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                            (&(this->super_SSLVersionTest).server_ctx_);
    }
    pSVar3 = SSL_new((SSL_CTX *)local_3a0);
    std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&local_50,(pointer)pSVar3);
    testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_70,&local_50,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a0,(internal *)local_70,(AssertionResult *)0x4e465b,"false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xc84,pcVar4);
      testing::internal::AssertHelper::operator=(&local_80,&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      testing::Message::~Message(&local_78);
    }
    invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    if (invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      if ((ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._7_1_ & 1) == 0) {
        pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
        SSL_set_connect_state(pSVar3);
      }
      else {
        pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
        SSL_set_accept_state(pSVar3);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      bVar1 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
      if (bVar1) {
        local_c3[2] = 0x16;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,local_c3 + 2);
        local_c3[1] = 0xfe;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,local_c3 + 1);
        local_c3[0] = 0xff;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,local_c3);
        for (local_c8 = 0; local_c8 < 8; local_c8 = local_c8 + 1) {
          local_cc[3] = 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,local_cc + 3);
        }
        local_cc[2] = 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,local_cc + 2);
        local_cc[1] = 1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,local_cc + 1);
        local_cc[0] = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,local_cc);
      }
      else {
        rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl._1_1_ = 0x69;
        rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl._2_1_ = 0x6e;
        rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl._3_1_ = 0x76;
        rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl._4_1_ = 0x61;
        rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl._5_1_ = 0x6c;
        rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl._6_1_ = 0x69;
        rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl._7_1_ = 100;
        __l._M_len = 7;
        __l._M_array = (iterator)
                       ((long)&rbio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t
                               .super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,__l);
      }
      buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      pBVar6 = BIO_new_mem_buf(buf,(int)sVar5);
      std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,(pointer)pBVar6
                );
      testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_100,
                 (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar1) {
        testing::Message::Message(&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&mem,(internal *)local_100,(AssertionResult *)"rbio","false","true",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xc9f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_110,&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        std::__cxx11::string::~string((string *)&mem);
        testing::Message::~Message(&local_108);
      }
      invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
        pbVar8 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::release
                           ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
        SSL_set0_rbio(psVar7,pbVar8);
        type = BIO_s_mem();
        pBVar6 = BIO_new(type);
        std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,
                   (pointer)pBVar6);
        testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_148,
                   (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
        if (!bVar1) {
          testing::Message::Message(&local_150);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_178,(internal *)local_148,(AssertionResult *)"mem","false","true",in_R9)
          ;
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_158,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xca3,pcVar4);
          testing::internal::AssertHelper::operator=(&local_158,&local_150);
          testing::internal::AssertHelper::~AssertHelper(&local_158);
          std::__cxx11::string::~string((string *)&local_178);
          testing::Message::~Message(&local_150);
        }
        invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
        if (invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          psVar7 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
          UpRef((bssl *)&gtest_ar.message_,(UniquePtr<BIO> *)&gtest_ar__2.message_);
          pbVar8 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::release
                             ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar.message_);
          SSL_set0_wbio(psVar7,pbVar8);
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar.message_);
          local_198[1] = 0xffffffff;
          pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
          local_198[0] = SSL_do_handshake(pSVar3);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_190,"-1","SSL_do_handshake(ssl.get())",local_198 + 1,
                     local_198);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
          if (!bVar1) {
            testing::Message::Message(&local_1a0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xca7,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,&local_1a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_1a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
          local_1c0[1] = 1;
          pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
          local_1c0[0] = SSL_get_error(pSVar3,-1);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1b8,"1","SSL_get_error(ssl.get(), -1)",local_1c0 + 1,
                     local_1c0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
          if (!bVar1) {
            testing::Message::Message(&local_1c8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffe30,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xca8,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffe30,&local_1c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe30)
            ;
            testing::Message::~Message(&local_1c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
          uVar9 = ERR_get_error();
          unused._4_4_ = (undefined4)uVar9;
          pbVar8 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
          local_1fc = BIO_mem_contents(pbVar8,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1f8,&local_1fc,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
          if (!bVar1) {
            testing::Message::Message(&local_208);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_2.message_,(internal *)local_1f8,
                       (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false",
                       "true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_210,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xcaf,pcVar4);
            testing::internal::AssertHelper::operator=(&local_210,&local_208);
            testing::internal::AssertHelper::~AssertHelper(&local_210);
            std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_208);
          }
          invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
          invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
          if (invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
            local_244 = 0;
            testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
                      ((internal *)local_240,"0u","len",&local_244,
                       (unsigned_long *)&gtest_ar__3.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
            if (!bVar1) {
              testing::Message::Message(&local_250);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcb0,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__4.message_,&local_250);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_250);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
            pbVar8 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_
                               );
            local_26c = BIO_reset(pbVar8);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_268,&local_26c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
            if (!bVar1) {
              testing::Message::Message(&local_278);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_3.message_,(internal *)local_268,
                         (AssertionResult *)"BIO_reset(mem.get())","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_280,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcb1,pcVar4);
              testing::internal::AssertHelper::operator=(&local_280,&local_278);
              testing::internal::AssertHelper::~AssertHelper(&local_280);
              std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
              testing::Message::~Message(&local_278);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
            local_2b8[1] = 0xffffffff;
            pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
            local_2b8[0] = SSL_write(pSVar3,"a",1);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_2b0,"-1","SSL_write(ssl.get(), \"a\", 1)",local_2b8 + 1,
                       local_2b8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
            if (!bVar1) {
              testing::Message::Message(&local_2c0);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcb4,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_2c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_2c0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
            local_2e0[1] = 1;
            pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get(&local_50);
            local_2e0[0] = SSL_get_error(pSVar3,-1);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_2d8,"1","SSL_get_error(ssl.get(), -1)",local_2e0 + 1,
                       local_2e0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
            if (!bVar1) {
              testing::Message::Message(&local_2e8);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcb5,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_5.message_,&local_2e8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_2e8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
            uVar9 = ERR_get_error();
            local_304 = (uint)uVar9;
            testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                      ((EqHelper *)local_300,"err","ERR_get_error()",(uint *)((long)&unused + 4),
                       &local_304);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
            if (!bVar1) {
              testing::Message::Message(&local_310);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcb6,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__5.message_,&local_310);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_310);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
            pbVar8 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_
                               );
            local_32c = BIO_mem_contents(pbVar8,(uint8_t **)&len,(size_t *)&gtest_ar__3.message_);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_328,&local_32c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
            if (!bVar1) {
              testing::Message::Message(&local_338);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_6.message_,(internal *)local_328,
                         (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false",
                         "true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_340,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xcb9,pcVar4);
              testing::internal::AssertHelper::operator=(&local_340,&local_338);
              testing::internal::AssertHelper::~AssertHelper(&local_340);
              std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_338);
            }
            invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
            invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
            if (invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
              local_374 = 0;
              testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                        ((EqHelper *)local_370,"0u","len",&local_374,
                         (unsigned_long *)&gtest_ar__3.message_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
              if (!bVar1) {
                testing::Message::Message(&local_380);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
                testing::internal::AssertHelper::AssertHelper
                          (&local_388,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xcba,pcVar4);
                testing::internal::AssertHelper::operator=(&local_388,&local_380);
                testing::internal::AssertHelper::~AssertHelper(&local_388);
                testing::Message::~Message(&local_380);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
              invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            }
          }
        }
        std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
      }
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    }
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
    testing::ScopedTrace::~ScopedTrace
              ((ScopedTrace *)
               ((long)&ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 6));
    if (invalid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) break;
    __end2 = __end2 + 1;
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, WriteAfterHandshakeSentFatalAlert) {
  for (bool test_server : {false, true}) {
    SCOPED_TRACE(test_server ? "server" : "client");

    bssl::UniquePtr<SSL> ssl(
        SSL_new(test_server ? server_ctx_.get() : client_ctx_.get()));
    ASSERT_TRUE(ssl);
    if (test_server) {
      SSL_set_accept_state(ssl.get());
    } else {
      SSL_set_connect_state(ssl.get());
    }

    std::vector<uint8_t> invalid;
    if (is_dtls()) {
      // In DTLS, invalid records are discarded. To cause the handshake to fail,
      // use a valid handshake record with invalid contents.
      invalid.push_back(SSL3_RT_HANDSHAKE);
      invalid.push_back(DTLS1_VERSION >> 8);
      invalid.push_back(DTLS1_VERSION & 0xff);
      // epoch and sequence_number
      for (int i = 0; i < 8; i++) {
        invalid.push_back(0);
      }
      // A one-byte fragment is invalid.
      invalid.push_back(0);
      invalid.push_back(1);
      // Arbitrary contents.
      invalid.push_back(0);
    } else {
      invalid = {'i', 'n', 'v', 'a', 'l', 'i', 'd'};
    }
    bssl::UniquePtr<BIO> rbio(BIO_new_mem_buf(invalid.data(), invalid.size()));
    ASSERT_TRUE(rbio);
    SSL_set0_rbio(ssl.get(), rbio.release());

    bssl::UniquePtr<BIO> mem(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(mem);
    SSL_set0_wbio(ssl.get(), bssl::UpRef(mem).release());

    // The handshake should fail.
    EXPECT_EQ(-1, SSL_do_handshake(ssl.get()));
    EXPECT_EQ(SSL_ERROR_SSL, SSL_get_error(ssl.get(), -1));
    uint32_t err = ERR_get_error();

    // |ssl| should have written an alert (and, in the client's case, a
    // ClientHello) to the transport.
    const uint8_t *unused;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_NE(0u, len);
    EXPECT_TRUE(BIO_reset(mem.get()));

    // Writing should fail, with the same error as the handshake.
    EXPECT_EQ(-1, SSL_write(ssl.get(), "a", 1));
    EXPECT_EQ(SSL_ERROR_SSL, SSL_get_error(ssl.get(), -1));
    EXPECT_EQ(err, ERR_get_error());

    // Nothing should be written to the transport.
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_EQ(0u, len);
  }
}